

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  ImGuiWindow *pIVar1;
  int iVar2;
  ImGuiContext *g;
  int iVar3;
  int iVar4;
  int iVar5;
  bool *pbVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  if (GImGui->LogEnabled == true) {
    *out_items_display_start = 0;
  }
  else {
    pIVar1 = GImGui->CurrentWindow;
    pbVar6 = &GImGui->CurrentTable->HostSkipItems;
    if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
      pbVar6 = &pIVar1->SkipItems;
    }
    if (*pbVar6 == true) {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
      return;
    }
    fVar8 = (pIVar1->ClipRect).Min.y;
    fVar7 = (pIVar1->ClipRect).Max.y;
    if (GImGui->NavMoveScoringItems == true) {
      fVar9 = (GImGui->NavScoringRect).Min.y;
      fVar10 = (GImGui->NavScoringRect).Max.y;
      if (fVar8 <= fVar9) {
        fVar9 = fVar8;
      }
      fVar8 = fVar9;
      if (fVar7 < fVar10) {
        fVar7 = fVar10;
      }
    }
    if ((GImGui->NavJustMovedToId != 0) && (pIVar1->NavLastIds[0] == GImGui->NavJustMovedToId)) {
      fVar9 = (pIVar1->Pos).y;
      fVar10 = pIVar1->NavRectRel[0].Min.y + fVar9;
      fVar9 = fVar9 + pIVar1->NavRectRel[0].Max.y;
      if (fVar8 <= fVar10) {
        fVar10 = fVar8;
      }
      fVar8 = fVar10;
      if (fVar7 < fVar9) {
        fVar7 = fVar9;
      }
    }
    fVar9 = (pIVar1->DC).CursorPos.y;
    iVar5 = (int)((fVar8 - fVar9) / items_height);
    iVar3 = (int)((fVar7 - fVar9) / items_height);
    if (GImGui->NavMoveScoringItems != false) {
      iVar5 = iVar5 - (uint)(GImGui->NavMoveClipDir == 2);
      iVar3 = iVar3 + (uint)(GImGui->NavMoveClipDir == 3);
    }
    iVar2 = items_count;
    if (iVar5 < items_count) {
      iVar2 = iVar5;
    }
    iVar4 = 0;
    if (-1 < iVar5) {
      iVar4 = iVar2;
    }
    iVar3 = iVar3 + 1;
    if (iVar3 < items_count) {
      items_count = iVar3;
    }
    if (iVar3 < iVar4) {
      items_count = iVar4;
    }
    *out_items_display_start = iVar4;
  }
  *out_items_display_end = items_count;
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (GetSkipItemForListClipping())
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the scoring rect which at worst should be 1 page away from ClipRect
    ImRect unclipped_rect = window->ClipRect;
    if (g.NavMoveScoringItems)
        unclipped_rect.Add(g.NavScoringRect);
    if (g.NavJustMovedToId && window->NavLastIds[0] == g.NavJustMovedToId)
        unclipped_rect.Add(ImRect(window->Pos + window->NavRectRel[0].Min, window->Pos + window->NavRectRel[0].Max)); // Could store and use NavJustMovedToRectRel

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((unclipped_rect.Min.y - pos.y) / items_height);
    int end = (int)((unclipped_rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    if (g.NavMoveScoringItems && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (g.NavMoveScoringItems && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}